

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::PatchPutValueNoLocalFastPathCantChangeType<Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId,Var newValue,
               PropertyOperationFlags flags)

{
  Type *pTVar1;
  bool bVar2;
  DynamicObject *pDVar3;
  
  bVar2 = VarIs<Js::DynamicObject>(instance);
  if (bVar2) {
    pDVar3 = UnsafeVarTo<Js::DynamicObject>(instance);
    pTVar1 = (pDVar3->super_RecyclableObject).type.ptr;
    PatchPutValueWithThisPtrNoLocalFastPath<true,Js::PolymorphicInlineCache>
              (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,instance,flags
              );
    if (pTVar1 != (Type *)0x0) {
      pDVar3 = UnsafeVarTo<Js::DynamicObject>(instance);
      return pTVar1 != (pDVar3->super_RecyclableObject).type.ptr;
    }
  }
  else {
    PatchPutValueWithThisPtrNoLocalFastPath<true,Js::PolymorphicInlineCache>
              (functionBody,inlineCache,inlineCacheIndex,instance,propertyId,newValue,instance,flags
              );
  }
  return false;
}

Assistant:

inline bool JavascriptOperators::PatchPutValueNoLocalFastPathCantChangeType(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId, Var newValue, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchPutValueNoLocalFastPathCantChangeType);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchPutValueNoLocalFastPathCantChangeType, Op_PatchPutValueNoLocalFastPath);

        Type * oldType = VarIs<DynamicObject>(instance) ? UnsafeVarTo<DynamicObject>(instance)->GetType() : nullptr;
        PatchPutValueWithThisPtrNoLocalFastPath<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, instance, propertyId, newValue, instance, flags);
        return (oldType != nullptr && oldType != UnsafeVarTo<DynamicObject>(instance)->GetType());

        JIT_HELPER_END(Op_PatchPutValueNoLocalFastPathCantChangeType);
    }